

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O0

Matrix4x4 * __thiscall
iDynTree::TransformDerivative::asHomogeneousTransformDerivative(TransformDerivative *this)

{
  Stride<0,_0> *this_00;
  double *dataPtr;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_> *this_01;
  VectorFixSize<3U> *in_RSI;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_RDI;
  Matrix4x4 *ret;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> dR;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> dp;
  Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_> retEigen;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *other
  ;
  PointerArgType in_stack_fffffffffffffee8;
  
  other = in_RDI;
  MatrixFixSize<4U,_4U>::MatrixFixSize((MatrixFixSize<4U,_4U> *)in_RDI);
  this_00 = (Stride<0,_0> *)MatrixFixSize<4U,_4U>::data((MatrixFixSize<4U,_4U> *)other);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_> *)in_RSI,
             in_stack_fffffffffffffee8,this_00);
  dataPtr = VectorFixSize<3U>::data(in_RSI);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RSI,
             dataPtr,this_00);
  this_01 = (DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_> *
            )MatrixFixSize<3U,_3U>::data((MatrixFixSize<3U,_3U> *)(in_RSI + 1));
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)in_RSI,
             dataPtr,this_00);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>>::block<3,3>
            (this_01,(Index)in_RSI,(Index)dataPtr);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_00,other);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>>::block<3,1>
            (this_01,(Index)in_RSI,(Index)dataPtr);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>,3,1,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
             *)this_00,
            (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)other);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>>::block<1,4>
            (this_01,(Index)in_RSI,(Index)dataPtr);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_1,_4,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_1,_4,_false>_>
             *)this_00);
  return (Matrix4x4 *)in_RDI;
}

Assistant:

Matrix4x4 TransformDerivative::asHomogeneousTransformDerivative() const
{
    Matrix4x4 ret;

    Eigen::Map< Eigen::Matrix<double,4,4,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    retEigen.block<3,3>(0,0) = dR;
    retEigen.block<3,1>(0,3) = dp;
    retEigen.block<1,4>(3,0).setZero();

    return ret;
}